

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall diy::FileStorage::destroy(FileStorage *this,int i)

{
  unsigned_long *puVar1;
  int __type;
  int __type_00;
  long in_RDI;
  CriticalMapAccessor accessor;
  FileRecord fr;
  FileRecord *in_stack_ffffffffffffff68;
  FileRecord *in_stack_ffffffffffffff70;
  resource_accessor<unsigned_long,_tthread::fast_mutex> local_78;
  key_type *in_stack_ffffffffffffffa8;
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  *in_stack_ffffffffffffffb0;
  _Base_ptr local_38;
  char local_30 [48];
  
  FileRecord::FileRecord((FileRecord *)0x11e88d);
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
            *)&stack0xffffffffffffffb0,(char *)(in_RDI + 0x20),__type);
  resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::operator*((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
               *)&stack0xffffffffffffffb0);
  std::
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  FileRecord::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::operator->((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
                *)&stack0xffffffffffffffb0);
  std::
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::erase((map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           *)in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
  resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::~resource_accessor
            ((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
              *)0x11e8fa);
  io::utils::remove(local_30);
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)&local_78,
             (char *)(in_RDI + 0x60),__type_00);
  puVar1 = resource_accessor<unsigned_long,_tthread::fast_mutex>::operator*(&local_78);
  *puVar1 = *puVar1 - (long)local_38;
  resource_accessor<unsigned_long,_tthread::fast_mutex>::~resource_accessor
            ((resource_accessor<unsigned_long,_tthread::fast_mutex> *)0x11e945);
  FileRecord::~FileRecord((FileRecord *)0x11e94f);
  return;
}

Assistant:

virtual void  destroy(int i) override
      {
        FileRecord      fr;
        {
          CriticalMapAccessor accessor = filenames_.access();
          fr = (*accessor)[i];
          accessor->erase(i);
        }
        io::utils::remove(fr.name);
        (*current_size_.access()) -= fr.size;
      }